

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O3

csp_callback_t csp_port_get_callback(uint port)

{
  if (port < 0x11) {
    if (ports[port].state != PORT_OPEN) {
      if (ports[port].state == PORT_OPEN_CB) {
        return (csp_callback_t)ports[port].field_1.socket;
      }
      if (ports[0x11].state == PORT_OPEN_CB) {
        return (csp_callback_t)ports[0x11].field_1.socket;
      }
    }
  }
  return (csp_callback_t)0x0;
}

Assistant:

csp_callback_t csp_port_get_callback(unsigned int port) {

	if (port > CSP_PORT_MAX_BIND) {
		return NULL;
	}

	/* Check if port is open callback */
	if (ports[port].state == PORT_OPEN_CB) {
		return ports[port].callback;
	}

	/* If it's open socket, then return no callback */
	if (ports[port].state == PORT_OPEN) {
		return NULL;
	}

	/* Otherwise check if we have a match all callback */
	if (ports[CSP_PORT_MAX_BIND + 1].state == PORT_OPEN_CB) {
		return ports[CSP_PORT_MAX_BIND + 1].callback;
	}

	return NULL;
}